

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::Utils::buffer::update
          (buffer *this,GLenum target,GLsizeiptr size,GLvoid *data,GLenum usage)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  GLenum usage_local;
  GLvoid *data_local;
  GLsizeiptr size_local;
  GLenum target_local;
  buffer *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x40))(target,this->m_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"bindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x68);
  (**(code **)(lVar4 + 0x150))(target,size,data,usage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"bufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x6b);
  return;
}

Assistant:

void Utils::buffer::update(glw::GLenum target, glw::GLsizeiptr size, glw::GLvoid* data, glw::GLenum usage)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(target, m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindBuffer");

	gl.bufferData(target, size, data, usage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bufferData");
}